

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>,_bool>
* __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
::
insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
          (pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>,_bool>
           *__return_storage_ptr__,
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
          *this,SymbolEntry *key,SymbolEntry *args)

{
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
  *comp;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *pbVar1;
  bool bVar2;
  SearchResult<unsigned_long,_false> SVar3;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *this_00;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *pbVar4;
  uint uVar5;
  ulong uVar6;
  iterator iVar7;
  
  if (*(long *)(this + 0x18) == 0) {
    this_00 = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
               *)Allocate<8ul,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
                           ((allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                             *)(this + 8),0x38);
    btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
    ::init_leaf(this_00,'\0','\x01',this_00);
    *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
      **)(this + 0x10) = this_00;
    *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
      **)this = this_00;
  }
  else {
    this_00 = *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                **)this;
  }
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  ::start(this_00);
  comp = this + 8;
  SVar3 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
          ::
          binary_search<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare>
                    ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
                      *)this_00,key,(checked_compare *)comp);
  while (((ulong)this_00 & 7) == 0) {
    if (this_00[0xb] !=
        (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
         )0x0) {
      uVar6 = SVar3.value & 0xffffffff;
      pbVar4 = this_00;
      goto LAB_00f3dd6d;
    }
    this_00 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::child(this_00,(field_type)SVar3.value);
    SVar3 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
            ::
            binary_search<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>::checked_compare>
                      ((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>
                        *)this_00,key,(checked_compare *)comp);
  }
LAB_00f3dd3f:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned ..." /* TRUNCATED STRING LITERAL */
               );
LAB_00f3dd6d:
  uVar5 = (uint)uVar6;
  if (((ulong)pbVar4 & 7) != 0) goto LAB_00f3dd3f;
  if (uVar5 != (byte)pbVar4[10]) {
    bVar2 = key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
            ::checked_compare::
            operator()<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_0>
                      ((checked_compare *)comp,key,
                       (SymbolEntry *)(pbVar4 + (long)(int)uVar5 * 0x28 + 0x10));
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00f3ddd0;
    }
    goto LAB_00f3ddb0;
  }
  pbVar1 = *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
             **)pbVar4;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_00f3dd3f;
  uVar6 = (ulong)(byte)pbVar4[8];
  pbVar4 = pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
       )0x0) {
LAB_00f3ddb0:
    iVar7._8_8_ = SVar3.value & 0xffffffff;
    iVar7.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                   *)this_00;
    iVar7 = internal_emplace<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&>
                      (this,iVar7,args);
    pbVar4 = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              *)iVar7.node_;
    uVar5 = iVar7.position_;
    bVar2 = true;
LAB_00f3ddd0:
    (__return_storage_ptr__->first).node_ = pbVar4;
    (__return_storage_ptr__->first).position_ = uVar5;
    __return_storage_ptr__->second = bVar2;
    return __return_storage_ptr__;
  }
  goto LAB_00f3dd6d;
}

Assistant:

auto btree<P>::insert_unique(const K &key, Args &&...args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = mutable_rightmost() = new_leaf_root_node(1);
  }

  SearchResult<iterator, is_key_compare_to::value> res = internal_locate(key);
  iterator iter = res.value;

  if (res.HasMatch()) {
    if (res.IsEq()) {
      // The key already exists in the tree, do nothing.
      return {iter, false};
    }
  } else {
    iterator last = internal_last(iter);
    if (last.node_ && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return {last, false};
    }
  }
  return {internal_emplace(iter, std::forward<Args>(args)...), true};
}